

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemIOCallback.cpp
# Opt level: O0

void __thiscall
libebml::MemIOCallback::setFilePointer(MemIOCallback *this,int64 Offset,seek_mode Mode)

{
  seek_mode Mode_local;
  int64 Offset_local;
  MemIOCallback *this_local;
  
  if (Mode == seek_beginning) {
    this->dataBufferPos = Offset;
  }
  else if (Mode == seek_current) {
    this->dataBufferPos = this->dataBufferPos + Offset;
  }
  else if (Mode == seek_end) {
    this->dataBufferPos = this->dataBufferTotalSize + Offset;
  }
  return;
}

Assistant:

void MemIOCallback::setFilePointer(int64 Offset, seek_mode Mode)
{
  if (Mode == seek_beginning)
    dataBufferPos = Offset;
  else if (Mode == seek_current)
    dataBufferPos = dataBufferPos + Offset;
  else if (Mode == seek_end)
    dataBufferPos = dataBufferTotalSize + Offset;
}